

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglobal.cpp
# Opt level: O3

uint qt_int_sqrt(uint n)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  if (n < 0x3fffffff) {
    uVar2 = 1;
    do {
      uVar3 = uVar2;
      uVar4 = (ulong)uVar3;
      uVar2 = uVar3 * 4;
    } while (uVar3 <= n);
    uVar2 = 0;
    if (uVar3 != 1) {
      uVar2 = 0;
      do {
        uVar4 = uVar4 >> 2;
        uVar3 = (uint)uVar4;
        uVar5 = uVar3 + uVar2;
        uVar1 = uVar3;
        if (n < uVar3 + uVar2) {
          uVar5 = 0;
          uVar1 = 0;
        }
        uVar2 = uVar1 + (uVar2 >> 1);
        n = n - uVar5;
      } while (uVar3 != 1);
    }
  }
  else {
    uVar2 = qt_int_sqrt(n >> 2);
    uVar3 = uVar2 * 2 + 1;
    uVar2 = uVar2 * 2;
    if (uVar3 * uVar3 <= n) {
      uVar2 = uVar3;
    }
  }
  return uVar2;
}

Assistant:

Q_CORE_EXPORT Q_DECL_CONST_FUNCTION unsigned int qt_int_sqrt(unsigned int n)
{
    // n must be in the range 0...UINT_MAX/2-1
    if (n >= (UINT_MAX >> 2)) {
        unsigned int r = 2 * qt_int_sqrt(n / 4);
        unsigned int r2 = r + 1;
        return (n >= r2 * r2) ? r2 : r;
    }
    uint h, p = 0, q = 1, r = n;
    while (q <= n)
        q <<= 2;
    while (q != 1) {
        q >>= 2;
        h = p + q;
        p >>= 1;
        if (r >= h) {
            p += q;
            r -= h;
        }
    }
    return p;
}